

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O3

void __thiscall
wabt::FileStream::FileStream(FileStream *this,string_view filename,Stream *log_stream)

{
  FILE *pFVar1;
  undefined1 local_48 [8];
  string_view filename_local;
  string filename_str;
  
  filename_local.data_ = (char *)filename.size_;
  local_48 = (undefined1  [8])filename.data_;
  (this->super_Stream).offset_ = 0;
  (this->super_Stream).result_.enum_ = Ok;
  (this->super_Stream).log_stream_ = log_stream;
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__FileStream_01546648;
  this->file_ = (FILE *)0x0;
  this->offset_ = 0;
  this->should_close_ = false;
  string_view::to_string_abi_cxx11_((string *)&filename_local.size_,(string_view *)local_48);
  pFVar1 = fopen((char *)filename_local.size_,"wb");
  this->file_ = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    wabt::FileStream((wabt *)&filename_local.size_);
  }
  else {
    this->should_close_ = true;
  }
  if ((size_type *)filename_local.size_ != &filename_str._M_string_length) {
    operator_delete((void *)filename_local.size_);
  }
  return;
}

Assistant:

FileStream::FileStream(string_view filename, Stream* log_stream)
    : Stream(log_stream), file_(nullptr), offset_(0), should_close_(false) {
  std::string filename_str = filename.to_string();
  file_ = fopen(filename_str.c_str(), "wb");

  // TODO(binji): this is pretty cheesy, should come up with a better API.
  if (file_) {
    should_close_ = true;
  } else {
    ERROR("fopen name=\"%s\" failed, errno=%d\n", filename_str.c_str(), errno);
  }
}